

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O3

void helper_idivb_AL_x86_64(CPUX86State *env,target_ulong t0)

{
  ulong uVar1;
  int iVar2;
  char cVar3;
  uintptr_t unaff_retaddr;
  
  cVar3 = (char)t0;
  if (cVar3 != '\0') {
    iVar2 = (int)(short)env->regs[0];
    uVar1 = (long)iVar2 / (long)(int)cVar3;
    if ((int)(char)uVar1 == (int)uVar1) {
      env->regs[0] = uVar1 & 0xff | env->regs[0] & 0xffffffffffff0000 |
                     (ulong)((iVar2 % (int)cVar3 & 0xffU) << 8);
      return;
    }
  }
  raise_exception_ra_x86_64(env,0,unaff_retaddr);
}

Assistant:

void helper_idivb_AL(CPUX86State *env, target_ulong t0)
{
    int num, den, q, r;

    num = (int16_t)env->regs[R_EAX];
    den = (int8_t)t0;
    if (den == 0) {
        raise_exception_ra(env, EXCP00_DIVZ, GETPC());
    }
    q = (num / den);
    if (q != (int8_t)q) {
        raise_exception_ra(env, EXCP00_DIVZ, GETPC());
    }
    q &= 0xff;
    r = (num % den) & 0xff;
    env->regs[R_EAX] = (env->regs[R_EAX] & ~0xffff) | (r << 8) | q;
}